

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowImpl.h
# Opt level: O0

void __thiscall FlowImpl::~FlowImpl(FlowImpl *this)

{
  FlowImpl *this_local;
  
  (this->super_Flow)._vptr_Flow = (_func_int **)&PTR___cxa_pure_virtual_00111b20;
  std::__cxx11::string::~string((string *)&this->name);
  Flow::~Flow(&this->super_Flow);
  return;
}

Assistant:

~FlowImpl() override = default;